

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * image_format_to_type_abi_cxx11_
                   (string *__return_storage_ptr__,ImageFormat fmt,BaseType basetype)

{
  CompilerError *this;
  char *pcVar1;
  char *pcVar2;
  
  switch(fmt) {
  case ImageFormatUnknown:
    if (basetype == Int) goto LAB_001a80a0;
    if (basetype == UInt) goto LAB_001a8333;
    if (basetype != Float) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError(this,"Unsupported base type for image.");
      break;
    }
    goto LAB_001a81a3;
  case ImageFormatRgba32f:
  case ImageFormatRgba16f:
    if (basetype != Float) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
LAB_001a81a3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "float4";
    pcVar1 = "";
LAB_001a8348:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
    return __return_storage_ptr__;
  case ImageFormatR32f:
  case ImageFormatR16f:
    if (basetype != Float) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "float";
    pcVar1 = "";
    goto LAB_001a8348;
  case ImageFormatRgba8:
  case ImageFormatRgba16:
    if (basetype != Float) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
    goto LAB_001a82db;
  case ImageFormatRgba8Snorm:
  case ImageFormatRgba16Snorm:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "snorm float4";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRg32f:
  case ImageFormatRg16f:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "float2";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatR11fG11fB10f:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "float3";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRgb10A2:
    if (basetype != Float) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
LAB_001a82db:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "unorm float4";
    pcVar1 = "";
    goto LAB_001a8348;
  case ImageFormatRg16:
  case ImageFormatRg8:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "unorm float2";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatR16:
  case ImageFormatR8:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "unorm float";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRg16Snorm:
  case ImageFormatRg8Snorm:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "snorm float2";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatR16Snorm:
  case ImageFormatR8Snorm:
    if (basetype == Float) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "snorm float";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRgba32i:
  case ImageFormatRgba16i:
  case ImageFormatRgba8i:
    if (basetype != Int) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
LAB_001a80a0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "int4";
    pcVar1 = "";
    goto LAB_001a8348;
  case ImageFormatR32i:
  case ImageFormatR16i:
  case ImageFormatR8i:
    if (basetype == Int) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "int";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRg32i:
  case ImageFormatRg16i:
  case ImageFormatRg8i:
    if (basetype == Int) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "int2";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRgba32ui:
  case ImageFormatRgba16ui:
  case ImageFormatRgba8ui:
    if (basetype != UInt) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
    goto LAB_001a8333;
  case ImageFormatR32ui:
  case ImageFormatR16ui:
  case ImageFormatR8ui:
    if (basetype == UInt) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "uint";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  case ImageFormatRgb10a2ui:
    if (basetype != UInt) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      spirv_cross::CompilerError::CompilerError
                (this,"Mismatch in image type and base type of image.");
      break;
    }
LAB_001a8333:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "uint4";
    pcVar1 = "";
    goto LAB_001a8348;
  case ImageFormatRg32ui:
  case ImageFormatRg16ui:
  case ImageFormatRg8ui:
    if (basetype == UInt) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "uint2";
      pcVar1 = "";
      goto LAB_001a8348;
    }
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Mismatch in image type and base type of image.")
    ;
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Unrecognized typed image format.");
  }
  __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static string image_format_to_type(ImageFormat fmt, SPIRType::BaseType basetype)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float";
	case ImageFormatRg8:
	case ImageFormatRg16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float2";
	case ImageFormatRgba8:
	case ImageFormatRgba16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";
	case ImageFormatRgb10A2:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";

	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float";
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float2";
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float4";

	case ImageFormatR16f:
	case ImageFormatR32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float";
	case ImageFormatRg16f:
	case ImageFormatRg32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float2";
	case ImageFormatRgba16f:
	case ImageFormatRgba32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float4";

	case ImageFormatR11fG11fB10f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float3";

	case ImageFormatR8i:
	case ImageFormatR16i:
	case ImageFormatR32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int";
	case ImageFormatRg8i:
	case ImageFormatRg16i:
	case ImageFormatRg32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int2";
	case ImageFormatRgba8i:
	case ImageFormatRgba16i:
	case ImageFormatRgba32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int4";

	case ImageFormatR8ui:
	case ImageFormatR16ui:
	case ImageFormatR32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint";
	case ImageFormatRg8ui:
	case ImageFormatRg16ui:
	case ImageFormatRg32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint2";
	case ImageFormatRgba8ui:
	case ImageFormatRgba16ui:
	case ImageFormatRgba32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";
	case ImageFormatRgb10a2ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";

	case ImageFormatUnknown:
		switch (basetype)
		{
		case SPIRType::Float:
			return "float4";
		case SPIRType::Int:
			return "int4";
		case SPIRType::UInt:
			return "uint4";
		default:
			SPIRV_CROSS_THROW("Unsupported base type for image.");
		}

	default:
		SPIRV_CROSS_THROW("Unrecognized typed image format.");
	}
}